

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::addCols(HighsSparseMatrix *this,HighsSparseMatrix *new_cols,int8_t *in_partition)

{
  int iVar1;
  value_type vVar2;
  bool bVar3;
  HighsInt HVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  long in_RSI;
  HighsSparseMatrix *in_RDI;
  HighsInt iRow_1;
  HighsInt iEl_3;
  HighsInt iCol;
  HighsInt iEl_2;
  HighsInt from_original_el;
  HighsInt iRow;
  HighsInt to_original_el;
  HighsInt entry_offset;
  HighsInt iEl_1;
  vector<int,_std::allocator<int>_> new_row_length;
  HighsInt iEl;
  HighsInt iNewCol_1;
  HighsInt iNewCol;
  HighsInt new_num_nz;
  HighsInt new_num_col;
  HighsInt num_nz;
  HighsInt num_row;
  HighsInt num_col;
  bool partitioned;
  vector<double,_std::allocator<double>_> *new_matrix_value;
  vector<int,_std::allocator<int>_> *new_matrix_index;
  vector<int,_std::allocator<int>_> *new_matrix_start;
  HighsInt num_new_nz;
  HighsInt num_new_col;
  HighsSparseMatrix *in_stack_fffffffffffffec8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  vector<int,_std::allocator<int>_> *this_02;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  value_type vVar9;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int iVar10;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  vector<int,_std::allocator<int>_> local_78;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar11;
  int local_58;
  int local_54;
  
  iVar11 = *(int *)(in_RSI + 4);
  local_94 = numNz(in_stack_fffffffffffffec8);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x10);
  this_01 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x40);
  if (iVar11 != 0) {
    iVar1 = in_RDI->num_col_;
    local_9c = in_RDI->num_row_;
    HVar4 = numNz(in_stack_fffffffffffffec8);
    if ((in_RDI->format_ == kRowwise) && (HVar4 < local_94)) {
      ensureColwise((HighsSparseMatrix *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    bVar3 = isColwise(in_RDI);
    if (bVar3) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      if (local_94 == 0) {
        for (local_58 = 0; local_58 < iVar11; local_58 = local_58 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(iVar1 + local_58));
          *pvVar6 = HVar4;
        }
      }
      else {
        for (local_54 = 0; local_54 < iVar11; local_54 = local_54 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_54);
          iVar10 = *pvVar5;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(iVar1 + local_54));
          *pvVar6 = HVar4 + iVar10;
        }
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->start_,(long)(iVar1 + iVar11));
      *pvVar6 = HVar4 + local_94;
      in_RDI->num_col_ = iVar11 + in_RDI->num_col_;
      if (0 < local_94) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        for (iVar11 = 0; iVar11 < local_94; iVar11 = iVar11 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iVar11);
          vVar2 = *pvVar5;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->index_,(long)(HVar4 + iVar11));
          *pvVar6 = vVar2;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x58),
                              (long)iVar11);
          vVar9 = *pvVar8;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)(HVar4 + iVar11));
          *pvVar7 = vVar9;
        }
      }
    }
    else {
      if (local_94 != 0) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x7e6f24);
        std::vector<int,_std::allocator<int>_>::assign
                  (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8,
                   (value_type_conflict2 *)0x7e6f49);
        for (local_90 = 0; local_90 < local_94; local_90 = local_90 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_90);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)*pvVar5);
          *pvVar6 = *pvVar6 + 1;
        }
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_9c);
        local_98 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_9c);
        *pvVar6 = HVar4 + local_94;
        while (local_9c = local_9c + -1, -1 < local_9c) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_9c);
          local_94 = local_94 - *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)local_9c);
          iVar10 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_9c);
          *pvVar6 = local_98 + local_94;
          while (local_a4 = local_98 + -1, iVar10 <= local_a4) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->index_,(long)local_a4);
            vVar2 = *pvVar6;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->index_,(long)(local_a4 + local_94));
            *pvVar6 = vVar2;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->value_,(long)local_a4);
            vVar9 = *pvVar7;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->value_,(long)(local_a4 + local_94));
            *pvVar7 = vVar9;
            local_98 = local_a4;
          }
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)local_9c);
          *pvVar6 = local_94 + iVar10;
          local_98 = iVar10;
        }
        for (local_a8 = 0; local_a8 < iVar11; local_a8 = local_a8 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_a8);
          local_ac = *pvVar5;
          while (iVar10 = local_ac,
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (this_00,(long)(local_a8 + 1)), iVar10 < *pvVar5) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_ac);
            iVar10 = *pvVar5;
            this_02 = &in_RDI->index_;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)iVar10);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)*pvVar6);
            *pvVar6 = iVar1 + local_a8;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x58),
                                (long)local_ac);
            vVar9 = *pvVar8;
            in_stack_fffffffffffffee0 = &in_RDI->value_;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)iVar10);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_fffffffffffffee0,(long)*pvVar6);
            *pvVar7 = vVar9;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)iVar10);
            *pvVar6 = *pvVar6 + 1;
            local_ac = local_ac + 1;
          }
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0);
      }
      in_RDI->num_col_ = iVar11 + in_RDI->num_col_;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::addCols(const HighsSparseMatrix new_cols,
                                const int8_t* in_partition) {
  assert(new_cols.isColwise());
  const HighsInt num_new_col = new_cols.num_col_;
  const HighsInt num_new_nz = new_cols.numNz();
  const vector<HighsInt>& new_matrix_start = new_cols.start_;
  const vector<HighsInt>& new_matrix_index = new_cols.index_;
  const vector<double>& new_matrix_value = new_cols.value_;

  assert(this->formatOk());
  // Adding columns to a row-wise partitioned matrix needs the
  // partition information
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  // Cannot handle the row-wise partitioned case
  assert(!partitioned);
  if (partitioned) {
    //    if (in_partition == NULL) { printf("in_partition == NULL\n"); }
    assert(in_partition != NULL);
  }
  assert(num_new_col >= 0);
  assert(num_new_nz >= 0);
  if (num_new_col == 0) {
    // No columns are being added, so check that no nonzeros are being
    // added
    assert(num_new_nz == 0);
    return;
  }
  // Adding a positive number of columns to a matrix
  if (num_new_nz) {
    // Nonzeros are being added, so ensure that non-null data are
    // being passed
    assert(!new_matrix_start.empty());
    assert(!new_matrix_index.empty());
    assert(!new_matrix_value.empty());
  }
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  // Check that nonzeros aren't being appended to a matrix with no rows
  assert(num_new_nz <= 0 || num_row > 0);

  // If matrix is currently a standard row-wise matrix and there are
  // more new nonzeros than current nonzeros so flip column-wise
  if (this->format_ == MatrixFormat::kRowwise && num_new_nz > num_nz)
    this->ensureColwise();

  // Determine the new number of columns and nonzeros in the matrix
  HighsInt new_num_col = num_col + num_new_col;
  HighsInt new_num_nz = num_nz + num_new_nz;

  if (this->isColwise()) {
    // Matrix is column-wise
    this->start_.resize(new_num_col + 1);
    // Append the starts of the new columns
    if (num_new_nz) {
      // Nontrivial number of nonzeros being added, so use new_matrix_start
      for (HighsInt iNewCol = 0; iNewCol < num_new_col; iNewCol++)
        this->start_[num_col + iNewCol] = num_nz + new_matrix_start[iNewCol];
    } else {
      // No nonzeros being added, so new_matrix_start may be null, but entries
      // of zero are implied.
      for (HighsInt iNewCol = 0; iNewCol < num_new_col; iNewCol++)
        this->start_[num_col + iNewCol] = num_nz;
    }
    this->start_[num_col + num_new_col] = new_num_nz;
    // Update the number of columns
    this->num_col_ += num_new_col;
    // If no nonzeros are being added then there's nothing else to do
    if (num_new_nz <= 0) return;
    // Adding a non-trivial matrix: resize the column-wise matrix arrays
    // accordingly
    this->index_.resize(new_num_nz);
    this->value_.resize(new_num_nz);
    // Copy in the new indices and values
    for (HighsInt iEl = 0; iEl < num_new_nz; iEl++) {
      this->index_[num_nz + iEl] = new_matrix_index[iEl];
      this->value_[num_nz + iEl] = new_matrix_value[iEl];
    }
  } else {
    // Matrix is row-wise
    if (num_new_nz) {
      // Adding a positive number of nonzeros
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Determine the row lengths of the new columns being added
      std::vector<HighsInt> new_row_length;
      new_row_length.assign(num_row, 0);
      for (HighsInt iEl = 0; iEl < num_new_nz; iEl++)
        new_row_length[new_matrix_index[iEl]]++;
      // Now shift the indices and values to make space
      HighsInt entry_offset = num_new_nz;
      HighsInt to_original_el = this->start_[num_row];
      this->start_[num_row] = new_num_nz;
      for (HighsInt iRow = num_row - 1; iRow >= 0; iRow--) {
        entry_offset -= new_row_length[iRow];
        HighsInt from_original_el = this->start_[iRow];
        // Can now use this new_row_length to store the start for the
        // new entries
        new_row_length[iRow] = to_original_el + entry_offset;
        for (HighsInt iEl = to_original_el - 1; iEl >= from_original_el;
             iEl--) {
          this->index_[iEl + entry_offset] = this->index_[iEl];
          this->value_[iEl + entry_offset] = this->value_[iEl];
        }
        to_original_el = from_original_el;
        this->start_[iRow] = entry_offset + from_original_el;
      }
      // Now insert the indices and values for the new columns
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++) {
        for (HighsInt iEl = new_matrix_start[iCol];
             iEl < new_matrix_start[iCol + 1]; iEl++) {
          HighsInt iRow = new_matrix_index[iEl];
          this->index_[new_row_length[iRow]] = num_col + iCol;
          this->value_[new_row_length[iRow]] = new_matrix_value[iEl];
          new_row_length[iRow]++;
        }
      }
    }
    // Have to increase the number of columns, even if no nonzeros are being
    // added
    this->num_col_ += num_new_col;
  }
}